

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O0

int __thiscall
ANN::NearestNeighbor(ANN *this,int *topology,double *scaling,ANNpoint *x,double *d_best)

{
  int iVar1;
  long *in_RCX;
  long in_RDX;
  long in_RDI;
  double *in_R8;
  double dVar2;
  int best_node;
  int i;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 4); local_2c = local_2c + 1) {
    *(double *)(*(long *)(in_RDI + 0x10) + (long)local_2c * 8) =
         *(double *)(in_RDX + (long)local_2c * 8) * *(double *)(*in_RCX + (long)local_2c * 8);
  }
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
            (*(undefined8 *)(in_RDI + 0x38),*(long **)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x10)
             ,1,*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20));
  iVar1 = *(int *)(*(long *)(in_RDI + 0x30) + (long)**(int **)(in_RDI + 0x18) * 4);
  dVar2 = sqrt(**(double **)(in_RDI + 0x20));
  *in_R8 = dVar2;
  return iVar1;
}

Assistant:

int ANN::NearestNeighbor(int *topology, double *scaling, const ANNpoint &x,
                         double &d_best) {
    int i;
    int best_node;  // index of the closest node to x

    // Transfer x to query_pt
    for (i = 0; i < dimension; i++) {
        query_pt[i] = scaling[i] * x[i];
    }

    the_tree->annkSearch(query_pt,  // query point
                         1,         // number of near neighbors
                         nn_idx,    // nearest neighbors (returned)
                         dists,     // distance (returned)
                         epsilon);  // error bound

    best_node = node_indices[nn_idx[0]];
    d_best = sqrt(dists[0]);
    return best_node;
}